

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O2

BOOL SetFileTime(HANDLE hFile,FILETIME *lpCreationTime,FILETIME *lpLastAccessTime,
                FILETIME *lpLastWriteTime)

{
  PAL_ERROR PVar1;
  uint uVar2;
  CPalThread *pThread;
  PAL_ERROR *pPVar3;
  int *piVar4;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    if ((((lpCreationTime == (FILETIME *)0x0) || (-1 < (int)lpCreationTime->dwHighDateTime)) &&
        ((lpLastAccessTime == (FILETIME *)0x0 || (-1 < (int)lpLastAccessTime->dwHighDateTime)))) &&
       ((lpLastWriteTime == (FILETIME *)0x0 || (-1 < (int)lpLastWriteTime->dwHighDateTime)))) {
      PVar1 = CorUnix::InternalSetFileTime
                        (pThread,hFile,lpCreationTime,lpLastAccessTime,lpLastWriteTime);
      if (PVar1 != 0) {
        pPVar3 = (PAL_ERROR *)__errno_location();
        *pPVar3 = PVar1;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003230d0;
      uVar2 = (uint)(PVar1 == 0);
    }
    else {
      piVar4 = __errno_location();
      *piVar4 = 6;
      uVar2 = 0;
    }
    return uVar2;
  }
LAB_003230d0:
  abort();
}

Assistant:

BOOL
PALAPI
SetFileTime(
        IN HANDLE hFile,
        IN CONST FILETIME *lpCreationTime,
        IN CONST FILETIME *lpLastAccessTime,
        IN CONST FILETIME *lpLastWriteTime)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    const UINT64 MAX_FILETIMEVALUE = 0x8000000000000000LL;

    PERF_ENTRY(SetFileTime);
    ENTRY("SetFileTime(hFile=%p, lpCreationTime=%p, lpLastAccessTime=%p, "
          "lpLastWriteTime=%p)\n", hFile, lpCreationTime, lpLastAccessTime, 
          lpLastWriteTime);

    pThread = InternalGetCurrentThread();

    /* validate filetime values */
    if ( (lpCreationTime && (((UINT64)lpCreationTime->dwHighDateTime   << 32) + 
          lpCreationTime->dwLowDateTime   >= MAX_FILETIMEVALUE)) ||        
         (lpLastAccessTime && (((UINT64)lpLastAccessTime->dwHighDateTime << 32) + 
          lpLastAccessTime->dwLowDateTime >= MAX_FILETIMEVALUE)) ||
         (lpLastWriteTime && (((UINT64)lpLastWriteTime->dwHighDateTime  << 32) + 
          lpLastWriteTime->dwLowDateTime  >= MAX_FILETIMEVALUE)))
    {
        pThread->SetLastError(ERROR_INVALID_HANDLE);
        return FALSE;
    }

    palError = InternalSetFileTime(
        pThread,
        hFile,
        lpCreationTime,
        lpLastAccessTime,
        lpLastWriteTime
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("SetFileTime returns BOOL %s\n", NO_ERROR == palError ? "TRUE":"FALSE");
    PERF_EXIT(SetFileTime);
    return NO_ERROR == palError;
}